

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

void __thiscall
QAbstractSpinBox::initStyleOption(QAbstractSpinBox *this,QStyleOptionSpinBox *option)

{
  SubControls *pSVar1;
  State *pSVar2;
  long lVar3;
  Int IVar4;
  int iVar5;
  Int IVar6;
  QStyle *pQVar7;
  
  if (option == (QStyleOptionSpinBox *)0x0) {
    return;
  }
  lVar3 = *(long *)(this + 8);
  QStyleOption::initFrom((QStyleOption *)option,(QWidget *)this);
  (option->super_QStyleOptionComplex).activeSubControls.
  super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i = 0;
  option->buttonSymbols = *(ButtonSymbols *)(lVar3 + 0x3c0);
  (option->super_QStyleOptionComplex).subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i = 8;
  pQVar7 = QWidget::style((QWidget *)this);
  iVar5 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x73,0,this,0);
  if (iVar5 != 0) {
    pSVar1 = &(option->super_QStyleOptionComplex).subControls;
    *(byte *)&(pSVar1->super_QFlagsStorageHelper<QStyle::SubControl,_4>).
              super_QFlagsStorage<QStyle::SubControl>.i =
         (byte)(pSVar1->super_QFlagsStorageHelper<QStyle::SubControl,_4>).
               super_QFlagsStorage<QStyle::SubControl>.i | 4;
  }
  if (*(int *)(lVar3 + 0x3c0) != 2) {
    pSVar1 = &(option->super_QStyleOptionComplex).subControls;
    *(byte *)&(pSVar1->super_QFlagsStorageHelper<QStyle::SubControl,_4>).
              super_QFlagsStorage<QStyle::SubControl>.i =
         (byte)(pSVar1->super_QFlagsStorageHelper<QStyle::SubControl,_4>).
               super_QFlagsStorage<QStyle::SubControl>.i | 3;
    if ((*(uint *)(lVar3 + 0x3cc) & 0x10) == 0) {
      if ((*(uint *)(lVar3 + 0x3cc) & 0x20) == 0) goto LAB_004405ff;
      IVar4 = 2;
    }
    else {
      IVar4 = 1;
    }
    (option->super_QStyleOptionComplex).activeSubControls.
    super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i =
         IVar4;
  }
LAB_004405ff:
  if (*(int *)(lVar3 + 0x3cc) == 0) {
    (option->super_QStyleOptionComplex).activeSubControls.
    super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i =
         *(Int *)(lVar3 + 0x3c4);
  }
  else {
    pSVar2 = &(option->super_QStyleOptionComplex).super_QStyleOption.state;
    *(byte *)&(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
              super_QFlagsStorage<QStyle::StateFlag>.i =
         (byte)(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
               super_QFlagsStorage<QStyle::StateFlag>.i | 4;
  }
  pQVar7 = QWidget::style((QWidget *)this);
  iVar5 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x38,0,this,0);
  if (iVar5 == 0) {
    IVar6 = 3;
  }
  else {
    IVar6 = (**(code **)(*(long *)this + 0x1c8))(this);
  }
  (option->stepEnabled).super_QFlagsStorageHelper<QAbstractSpinBox::StepEnabledFlag,_4>.
  super_QFlagsStorage<QAbstractSpinBox::StepEnabledFlag>.i = IVar6;
  option->frame = (bool)(*(byte *)(lVar3 + 0x3d0) >> 4 & 1);
  return;
}

Assistant:

void QAbstractSpinBox::initStyleOption(QStyleOptionSpinBox *option) const
{
    if (!option)
        return;

    Q_D(const QAbstractSpinBox);
    option->initFrom(this);
    option->activeSubControls = QStyle::SC_None;
    option->buttonSymbols = d->buttonSymbols;
    option->subControls = QStyle::SC_SpinBoxEditField;
    if (style()->styleHint(QStyle::SH_SpinBox_ButtonsInsideFrame, nullptr, this))
        option->subControls |= QStyle::SC_SpinBoxFrame;
    if (d->buttonSymbols != QAbstractSpinBox::NoButtons) {
        option->subControls |= QStyle::SC_SpinBoxUp | QStyle::SC_SpinBoxDown;
        if (d->buttonState & Up) {
            option->activeSubControls = QStyle::SC_SpinBoxUp;
        } else if (d->buttonState & Down) {
            option->activeSubControls = QStyle::SC_SpinBoxDown;
        }
    }

    if (d->buttonState) {
        option->state |= QStyle::State_Sunken;
    } else {
        option->activeSubControls = d->hoverControl;
    }

    option->stepEnabled = style()->styleHint(QStyle::SH_SpinControls_DisableOnBounds, nullptr, this)
                      ? stepEnabled()
                      : (QAbstractSpinBox::StepDownEnabled|QAbstractSpinBox::StepUpEnabled);

    option->frame = d->frame;
}